

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

bool __thiscall
nuraft::asio_rpc_client::verify_certificate
          (asio_rpc_client *this,bool preverified,verify_context *ctx)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  X509_STORE_CTX *ctx_00;
  X509_NAME *a;
  element_type *peVar4;
  options *poVar5;
  verify_context *in_RDX;
  byte in_SIL;
  long in_RDI;
  X509 *cert;
  char subject_name [256];
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  allocator local_181;
  string local_180 [48];
  string local_150 [32];
  X509 *local_130;
  char local_128 [264];
  verify_context *local_20;
  byte local_11;
  
  local_11 = in_SIL & 1;
  local_20 = in_RDX;
  asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18));
  bVar1 = std::function::operator_cast_to_bool
                    ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x258a48);
  if (bVar1) {
    ctx_00 = (X509_STORE_CTX *)asio::ssl::verify_context::native_handle(local_20);
    local_130 = X509_STORE_CTX_get_current_cert(ctx_00);
    a = X509_get_subject_name(local_130);
    X509_NAME_oneline(a,local_128,0x100);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x310));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x258abb);
      iVar3 = (*peVar4->_vptr_logger[7])();
      if (4 < iVar3) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x258ade);
        msg_if_given_abi_cxx11_((char *)local_150,"given subject: %s",local_128);
        (*peVar4->_vptr_logger[8])
                  (peVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"verify_certificate",0x3b8,local_150);
        std::__cxx11::string::~string(local_150);
      }
    }
    poVar5 = asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18));
    this_00 = &poVar5->verify_sn_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,local_128,&local_181);
    bVar1 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffe4f,
                                             CONCAT16(in_stack_fffffffffffffe4e,
                                                      in_stack_fffffffffffffe48)));
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    if ((bVar2 & 1) != 0) {
      return false;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool verify_certificate(bool preverified,
                            asio::ssl::verify_context& ctx)
    {
        if (impl_->get_options().verify_sn_) {
            char subject_name[256];
            X509* cert = X509_STORE_CTX_get_current_cert( ctx.native_handle() );
            X509_NAME_oneline( X509_get_subject_name(cert), subject_name, 256 );
            p_db("given subject: %s", subject_name);
            if ( !impl_->get_options().verify_sn_(subject_name) ) {
                return false;
            }
        }
        return preverified;
    }